

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O3

void __thiscall RecoveryTest_SigillTest_Test::TestBody(RecoveryTest_SigillTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  byte bVar4;
  DeathTest *pDVar6;
  DeathTest *gtest_dt;
  char regex [19];
  DeathTest *local_108;
  DeathTest *local_100;
  ExitedOrKilled local_f8 [4];
  char local_d8 [24];
  RE local_c0;
  byte bVar5;
  
  builtin_strncpy(local_d8,"posixSignalHandler",0x13);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init(&local_c0,local_d8);
    bVar2 = testing::internal::DeathTest::Create
                      ("RaiseSigill()",&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                       ,0x4c,&local_108);
    pDVar6 = local_108;
    if (bVar2) {
      if (local_108 != (DeathTest *)0x0) {
        local_100 = local_108;
        iVar3 = (*local_108->_vptr_DeathTest[2])(local_108);
        pDVar1 = local_108;
        if (iVar3 == 0) {
          extensions::ExitedOrKilled::ExitedOrKilled(local_f8,3,4);
          iVar3 = (*local_108->_vptr_DeathTest[3])();
          bVar2 = extensions::ExitedOrKilled::operator()(local_f8,iVar3);
          iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
          bVar5 = (byte)iVar3;
          bVar4 = bVar5 ^ 1;
        }
        else {
          bVar5 = 1;
          if (iVar3 == 1) {
            bVar2 = testing::internal::AlwaysTrue();
            if (bVar2) {
              RaiseSigill();
            }
            (*local_108->_vptr_DeathTest[5])(local_108,2);
            (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
            pDVar6 = local_100;
            if (local_100 == (DeathTest *)0x0) goto LAB_0010cd76;
          }
          bVar4 = 0;
        }
        bVar2 = testing::internal::IsTrue(true);
        if (bVar2) {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
        }
        if (bVar5 == 0) {
          testing::internal::RE::~RE(&local_c0);
          if (bVar4 == 0) {
            return;
          }
          goto LAB_0010cca7;
        }
      }
LAB_0010cd76:
      testing::internal::RE::~RE(&local_c0);
      return;
    }
    testing::internal::RE::~RE(&local_c0);
  }
LAB_0010cca7:
  testing::Message::Message((Message *)&local_c0);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_f8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x4c,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
  if ((((long *)local_c0.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_c0.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_c0.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST_F (RecoveryTest, SigillTest) {
#ifdef _WIN32
    const char regex[] = "::SigillHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif

    ASSERT_EXIT(RaiseSigill(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGILL), regex);
}